

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::encryption_handler::switch_recv_crypto
          (encryption_handler *this,shared_ptr<libtorrent::crypto_plugin> *crypto,
          crypto_receive_buffer *recv_buffer)

{
  element_type *peVar1;
  int local_1c [3];
  
  (this->m_dec_handler).super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_dec_handler).
              super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  peVar1 = (crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_1c[0] = 0;
  }
  else {
    (*peVar1->_vptr_crypto_plugin[5])(local_1c,peVar1,0,0);
  }
  crypto_receive_buffer::crypto_reset(recv_buffer,local_1c[0]);
  return;
}

Assistant:

void encryption_handler::switch_recv_crypto(std::shared_ptr<crypto_plugin> crypto
		, aux::crypto_receive_buffer& recv_buffer)
	{
		m_dec_handler = crypto;
		int packet_size = 0;
		if (crypto)
		{
			int consume = 0;
			int produce = 0;
			std::vector<span<char>> wr_buf;
			std::tie(consume, produce, packet_size) = crypto->decrypt(wr_buf);
			TORRENT_ASSERT(wr_buf.empty());
			TORRENT_ASSERT(consume == 0);
			TORRENT_ASSERT(produce == 0);
		}
		recv_buffer.crypto_reset(packet_size);
	}